

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O3

void __thiscall
clipp::parameter::add_flags<std::__cxx11::string,char_const(&)[14]>
          (parameter *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s1,
          char (*s2) [14])

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  arg_string local_60;
  arg_string local_40;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&this->flags_,2);
  local_60._M_dataplus._M_p = (s1->_M_dataplus)._M_p;
  paVar1 = &s1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p == paVar1) {
    local_60.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_60.field_2._8_8_ = *(undefined8 *)((long)&s1->field_2 + 8);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_60._M_string_length = s1->_M_string_length;
  (s1->_M_dataplus)._M_p = (pointer)paVar1;
  s1->_M_string_length = 0;
  (s1->field_2)._M_local_buf[0] = '\0';
  add_flags(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  sVar2 = strlen(*s2);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,s2,*s2 + sVar2);
  add_flags(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void
    add_flags(String1&& s1, String2&& s2, Strings&&... ss) {
        flags_.reserve(2 + sizeof...(ss));
        add_flags(std::forward<String1>(s1));
        add_flags(std::forward<String2>(s2), std::forward<Strings>(ss)...);
    }